

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O2

size_t portability_path_get_fullname(char *path,size_t path_size,char *name,size_t name_size)

{
  ulong uVar1;
  ulong uVar2;
  
  if (name == (char *)0x0 || path == (char *)0x0) {
    return 0;
  }
  uVar2 = 0;
  uVar1 = 0;
  while (((uVar2 < path_size && (path[uVar2] != '\0')) && (uVar1 < name_size))) {
    name[uVar1] = path[uVar2];
    uVar1 = uVar1 + 1;
    if (path[uVar2] == '/') {
      uVar1 = 0;
    }
    uVar2 = uVar2 + 1;
  }
  name[uVar1] = '\0';
  return uVar1 + 1;
}

Assistant:

size_t portability_path_get_fullname(const char *path, size_t path_size, char *name, size_t name_size)
{
	if (path == NULL || name == NULL)
	{
		return 0;
	}

	size_t i, count;

	for (i = 0, count = 0; path[i] != '\0' && i < path_size && count < name_size; ++i)
	{
		name[count++] = path[i];

		if (PORTABILITY_PATH_SEPARATOR(path[i]))
		{
			count = 0;
		}
	}

	name[count] = '\0';

	return count + 1;
}